

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O2

void __thiscall QComboBox::clearEditText(QComboBox *this)

{
  QLineEdit *this_00;
  long in_FS_OFFSET;
  QAccessibleValueChangeEvent event;
  QArrayDataPointer<char16_t> local_a8;
  QVariant local_88;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QLineEdit **)(*(long *)&(this->super_QWidget).field_0x8 + 0x2a0);
  if (this_00 != (QLineEdit *)0x0) {
    QLineEdit::clear(this_00);
  }
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_a8.d = (Data *)0x0;
  local_a8.ptr = (char16_t *)0x0;
  local_a8.size = 0;
  ::QVariant::QVariant(&local_88,(QString *)&local_a8);
  QAccessibleValueChangeEvent::QAccessibleValueChangeEvent
            ((QAccessibleValueChangeEvent *)&local_68,(QObject *)this,&local_88);
  ::QVariant::~QVariant(&local_88);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
  QAccessible::updateAccessibility((QAccessibleEvent *)&local_68);
  QAccessibleValueChangeEvent::~QAccessibleValueChangeEvent
            ((QAccessibleValueChangeEvent *)&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBox::clearEditText()
{
    Q_D(QComboBox);
    if (d->lineEdit)
        d->lineEdit->clear();
#if QT_CONFIG(accessibility)
    QAccessibleValueChangeEvent event(this, QString());
    QAccessible::updateAccessibility(&event);
#endif
}